

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O1

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::CheckDoubleMinimum
          (Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context,double d)

{
  bool bVar1;
  ValueType *this_00;
  Ch *pCVar2;
  ValidateErrorCode validateErrorCode;
  double dVar3;
  
  bVar1 = this->exclusiveMinimum_;
  dVar3 = GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::GetDouble(&this->minimum_);
  if (bVar1 == true) {
    if (dVar3 < d) {
      return true;
    }
  }
  else if (dVar3 <= d) {
    return true;
  }
  (*context->error_handler->_vptr_IValidationErrorHandler[10])
            (d,context->error_handler,&this->minimum_,(ulong)this->exclusiveMinimum_);
  validateErrorCode = (uint)this->exclusiveMinimum_ | kValidateErrorMinimum;
  context->invalidCode = validateErrorCode;
  this_00 = GetValidateErrorKeyword(validateErrorCode);
  pCVar2 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar2;
  return false;
}

Assistant:

bool CheckDoubleMinimum(Context& context, double d) const {
        if (exclusiveMinimum_ ? d <= minimum_.GetDouble() : d < minimum_.GetDouble()) {
            context.error_handler.BelowMinimum(d, minimum_, exclusiveMinimum_);
            RAPIDJSON_INVALID_KEYWORD_RETURN(exclusiveMinimum_ ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum);
        }
        return true;
    }